

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

int __thiscall Engine::init(Engine *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  IntVar **ppIVar5;
  uint i_2;
  uint i_1;
  IntVar *v;
  uint i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar6;
  IntVar *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar7;
  
  uVar7 = 0;
  while (uVar6 = uVar7, uVar1 = vec<IntVar_*>::size(&this->vars), uVar7 < uVar1) {
    ctx = (EVP_PKEY_CTX *)(ulong)uVar6;
    ppIVar5 = vec<IntVar_*>::operator[](&this->vars,uVar6);
    in_stack_ffffffffffffffe8 = *ppIVar5;
    uVar1 = vec<IntVar::PropInfo>::size(&in_stack_ffffffffffffffe8->pinfo);
    if (uVar1 == 0) {
      in_stack_ffffffffffffffe8->in_queue = true;
    }
    else {
      IntVar::pushInQueue((IntVar *)CONCAT44(uVar7,in_stack_ffffffffffffffd0));
    }
    uVar7 = uVar6 + 1;
  }
  if ((so.lazy & 1U) == 0) {
    uVar7 = 0;
    while (uVar1 = uVar7, uVar4 = vec<IntVar_*>::size(&this->vars), uVar7 < uVar4) {
      vec<IntVar_*>::operator[](&this->vars,uVar1);
      ctx = (EVP_PKEY_CTX *)0x1;
      IntVar::initVals((IntVar *)CONCAT44(uVar6,in_stack_fffffffffffffff0),
                       SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0));
      uVar7 = uVar1 + 1;
    }
  }
  else {
    uVar7 = 0;
    while (uVar6 = uVar7, uVar1 = vec<IntVar_*>::size(&this->vars), uVar7 < uVar1) {
      vec<IntVar_*>::operator[](&this->vars,uVar6);
      iVar2 = IntVar::getMax((IntVar *)0x2b2113);
      vec<IntVar_*>::operator[](&this->vars,uVar6);
      iVar3 = IntVar::getMin((IntVar *)0x2b212d);
      if (so.eager_limit < iVar2 - iVar3) {
        if (1 < so.verbosity) {
          std::operator<<((ostream *)&std::cerr,"using lazy literal\n");
        }
        ctx = (EVP_PKEY_CTX *)(ulong)uVar6;
        vec<IntVar_*>::operator[](&this->vars,uVar6);
        IntVar::specialiseToLL((IntVar *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
      }
      else {
        ctx = (EVP_PKEY_CTX *)(ulong)uVar6;
        vec<IntVar_*>::operator[](&this->vars,uVar6);
        IntVar::specialiseToEL((IntVar *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
      }
      uVar7 = uVar6 + 1;
    }
  }
  process_ircs();
  wf_init();
  if ((so.mip & 1U) != 0) {
    MIP::init(mip,ctx);
  }
  SAT::init(&sat,ctx);
  (*this->problem->_vptr_Problem[1])();
  if ((so.ldsb & 1U) != 0) {
    LDSB::init(&ldsb,ctx);
  }
  if ((so.mip & 1U) != 0) {
    MIP::presolve(mip);
  }
  this->finished_init = true;
  return (int)this;
}

Assistant:

void Engine::init() {
	// Get the vars ready
	for (unsigned int i = 0; i < vars.size(); i++) {
		IntVar* v = vars[i];
		if (v->pinfo.size() == 0) {
			v->in_queue = true;
		} else {
			v->pushInQueue();
		}
	}

	if (so.lazy) {
		for (unsigned int i = 0; i < vars.size(); i++) {
			if (vars[i]->getMax() - vars[i]->getMin() <= so.eager_limit) {
				vars[i]->specialiseToEL();
			} else {
				if (so.verbosity >= 2) {
					std::cerr << "using lazy literal\n";
				}
				vars[i]->specialiseToLL();
			}
		}
	} else {
		for (unsigned int i = 0; i < vars.size(); i++) {
			vars[i]->initVals(true);
		}
	}

	// Get the propagators ready

	process_ircs();

	// Get well founded propagators ready

	wf_init();

	// Get MIP propagator ready

	if (so.mip) {
		mip->init();
	}

	// Get SAT propagator ready

	sat.init();

	// Set lits allowed to be in learnt clauses
	problem->restrict_learnable();

	// Get LDSB ready

	if (so.ldsb) {
		ldsb.init();
	}

	// Do MIP presolve

	if (so.mip) {
		mip->presolve();
	}

	// Ready

	finished_init = true;
}